

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

unsigned_short __thiscall Am_Dependency_Iterator::Length(Am_Dependency_Iterator *this)

{
  Am_Slot_Data *pAVar1;
  CItem *local_28;
  CItem *current;
  unsigned_short count;
  Am_Dependency_Iterator *this_local;
  
  pAVar1 = Am_Slot::operator_cast_to_Am_Slot_Data_(&this->context);
  if (pAVar1 == (Am_Slot_Data *)0x0) {
    this_local._6_2_ = 0;
  }
  else {
    current._6_2_ = 0;
    pAVar1 = Am_Slot::operator_cast_to_Am_Slot_Data_(&this->context);
    for (local_28 = (pAVar1->dependencies).head; local_28 != (CItem *)0x0; local_28 = local_28->next
        ) {
      current._6_2_ = current._6_2_ + 1;
    }
    this_local._6_2_ = current._6_2_;
  }
  return this_local._6_2_;
}

Assistant:

unsigned short
Am_Dependency_Iterator::Length() const
{
  if (context) {
    unsigned short count = 0;
    CItem *current = ((Am_Slot_Data *)context)->dependencies.head;
    while (current) {
      ++count;
      current = current->next;
    }
    return count;
  } else
    return 0;
}